

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O0

uchar * convert_image_to_DXT5(uchar *uncompressed,int width,int height,int channels,int *out_size)

{
  char cVar1;
  int iVar2;
  int local_ac;
  int local_a8;
  int my;
  int mx;
  int idx;
  int has_alpha;
  int block_count;
  int chan_step;
  int index;
  uchar cblock [8];
  uchar ublock [64];
  int y;
  int x;
  int j;
  int i;
  uchar *compressed;
  int *out_size_local;
  int channels_local;
  int height_local;
  int width_local;
  uchar *uncompressed_local;
  
  block_count = 0;
  *out_size = 0;
  if ((((width < 1) || (height < 1)) || (uncompressed == (uchar *)0x0)) ||
     ((channels < 1 || (4 < channels)))) {
    uncompressed_local = (uchar *)0x0;
  }
  else {
    has_alpha = (int)(2 < channels);
    cVar1 = '\x01' - ((byte)channels & 1);
    *out_size = (width + 3 >> 2) * (height + 3 >> 2) * 0x10;
    uncompressed_local = (uchar *)malloc((long)*out_size);
    for (y = 0; y < height; y = y + 4) {
      for (x = 0; x < width; x = x + 4) {
        my = 0;
        local_a8 = 4;
        local_ac = 4;
        if (height <= y + 4) {
          local_ac = height - y;
        }
        if (width <= x + 4) {
          local_a8 = width - x;
        }
        ublock[0x38] = '\0';
        ublock[0x39] = '\0';
        ublock[0x3a] = '\0';
        ublock[0x3b] = '\0';
        for (; (int)ublock._56_4_ < local_ac; ublock._56_4_ = ublock._56_4_ + 1) {
          ublock[0x3c] = '\0';
          ublock[0x3d] = '\0';
          ublock[0x3e] = '\0';
          ublock[0x3f] = '\0';
          for (; (int)ublock._60_4_ < local_a8; ublock._60_4_ = ublock._60_4_ + 1) {
            cblock[my] = uncompressed
                         [(y + ublock._56_4_) * width * channels + (x + ublock._60_4_) * channels];
            cblock[my + 1] =
                 uncompressed
                 [(y + ublock._56_4_) * width * channels + (x + ublock._60_4_) * channels +
                  has_alpha];
            iVar2 = my + 3;
            cblock[my + 2] =
                 uncompressed
                 [(y + ublock._56_4_) * width * channels + (x + ublock._60_4_) * channels +
                  has_alpha * 2];
            my = my + 4;
            cblock[iVar2] =
                 cVar1 * uncompressed
                         [(y + ublock._56_4_) * width * channels + (x + ublock._60_4_) * channels +
                          channels + -1] - ('\x01' - cVar1);
          }
          ublock[0x3c] = (undefined1)local_a8;
          ublock[0x3d] = local_a8._1_1_;
          ublock[0x3e] = local_a8._2_1_;
          ublock[0x3f] = local_a8._3_1_;
          for (; (int)ublock._60_4_ < 4; ublock._60_4_ = ublock._60_4_ + 1) {
            cblock[my] = cblock[0];
            cblock[my + 1] = cblock[1];
            iVar2 = my + 3;
            cblock[my + 2] = cblock[2];
            my = my + 4;
            cblock[iVar2] = cblock[3];
          }
        }
        ublock[0x38] = (undefined1)local_ac;
        ublock[0x39] = local_ac._1_1_;
        ublock[0x3a] = local_ac._2_1_;
        ublock[0x3b] = local_ac._3_1_;
        for (; (int)ublock._56_4_ < 4; ublock._56_4_ = ublock._56_4_ + 1) {
          ublock[0x3c] = '\0';
          ublock[0x3d] = '\0';
          ublock[0x3e] = '\0';
          ublock[0x3f] = '\0';
          for (; (int)ublock._60_4_ < 4; ublock._60_4_ = ublock._60_4_ + 1) {
            cblock[my] = cblock[0];
            cblock[my + 1] = cblock[1];
            iVar2 = my + 3;
            cblock[my + 2] = cblock[2];
            my = my + 4;
            cblock[iVar2] = cblock[3];
          }
        }
        compress_DDS_alpha_block(cblock,(uchar *)&chan_step);
        ublock[0x3c] = '\0';
        ublock[0x3d] = '\0';
        ublock[0x3e] = '\0';
        ublock[0x3f] = '\0';
        for (; (int)ublock._60_4_ < 8; ublock._60_4_ = ublock._60_4_ + 1) {
          uncompressed_local[block_count] = *(uchar *)((long)&chan_step + (long)(int)ublock._60_4_);
          block_count = block_count + 1;
        }
        compress_DDS_color_block(4,cblock,(uchar *)&chan_step);
        ublock[0x3c] = '\0';
        ublock[0x3d] = '\0';
        ublock[0x3e] = '\0';
        ublock[0x3f] = '\0';
        for (; (int)ublock._60_4_ < 8; ublock._60_4_ = ublock._60_4_ + 1) {
          uncompressed_local[block_count] = *(uchar *)((long)&chan_step + (long)(int)ublock._60_4_);
          block_count = block_count + 1;
        }
      }
    }
  }
  return uncompressed_local;
}

Assistant:

unsigned char* convert_image_to_DXT5(
		const unsigned char *const uncompressed,
		int width, int height, int channels,
		int *out_size )
{
	unsigned char *compressed;
	int i, j, x, y;
	unsigned char ublock[16*4];
	unsigned char cblock[8];
	int index = 0, chan_step = 1;
	int block_count = 0, has_alpha;
	/*	error check	*/
	*out_size = 0;
	if( (width < 1) || (height < 1) ||
		(NULL == uncompressed) ||
		(channels < 1) || ( channels > 4) )
	{
		return NULL;
	}
	/*	for channels == 1 or 2, I do not step forward for R,G,B vales	*/
	if( channels < 3 )
	{
		chan_step = 0;
	}
	/*	# channels = 1 or 3 have no alpha, 2 & 4 do have alpha	*/
	has_alpha = 1 - (channels & 1);
	/*	get the RAM for the compressed image
		(16 bytes per 4x4 pixel block)	*/
	*out_size = ((width+3) >> 2) * ((height+3) >> 2) * 16;
	compressed = (unsigned char*)malloc( *out_size );
	/*	go through each block	*/
	for( j = 0; j < height; j += 4 )
	{
		for( i = 0; i < width; i += 4 )
		{
			/*	local variables, and my block counter	*/
			int idx = 0;
			int mx = 4, my = 4;
			if( j+4 >= height )
			{
				my = height - j;
			}
			if( i+4 >= width )
			{
				mx = width - i;
			}
			for( y = 0; y < my; ++y )
			{
				for( x = 0; x < mx; ++x )
				{
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step+chan_step];
					ublock[idx++] =
						has_alpha * uncompressed[(j+y)*width*channels+(i+x)*channels+channels-1]
						+ (1-has_alpha)*255;
				}
				for( x = mx; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
					ublock[idx++] = ublock[3];
				}
			}
			for( y = my; y < 4; ++y )
			{
				for( x = 0; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
					ublock[idx++] = ublock[3];
				}
			}
			/*	now compress the alpha block	*/
			compress_DDS_alpha_block( ublock, cblock );
			/*	copy the data from the compressed alpha block into the main buffer	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
			/*	then compress the color block	*/
			++block_count;
			compress_DDS_color_block( 4, ublock, cblock );
			/*	copy the data from the compressed color block into the main buffer	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
		}
	}
	return compressed;
}